

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

void ps_parser_to_token(PS_Parser parser,T1_Token token)

{
  FT_Byte FVar1;
  FT_Byte *limit_00;
  FT_Error FVar2;
  undefined4 uVar3;
  bool bVar4;
  int local_2c;
  FT_Int embed;
  FT_Byte *limit;
  FT_Byte *cur;
  T1_Token token_local;
  PS_Parser parser_local;
  
  token->type = T1_TOKEN_TYPE_NONE;
  token->start = (FT_Byte *)0x0;
  token->limit = (FT_Byte *)0x0;
  cur = (FT_Byte *)token;
  token_local = (T1_Token)parser;
  ps_parser_skip_spaces(parser);
  limit = token_local->start;
  limit_00 = *(FT_Byte **)&token_local->type;
  if (limit_00 <= limit) {
    return;
  }
  FVar1 = *limit;
  if (FVar1 == '(') {
    cur[0x10] = '\x02';
    cur[0x11] = '\0';
    cur[0x12] = '\0';
    cur[0x13] = '\0';
    *(FT_Byte **)cur = limit;
    FVar2 = skip_literal_string(&limit,limit_00);
    if (FVar2 == 0) {
      *(FT_Byte **)(cur + 8) = limit;
    }
  }
  else {
    if (FVar1 == '[') {
      cur[0x10] = '\x03';
      cur[0x11] = '\0';
      cur[0x12] = '\0';
      cur[0x13] = '\0';
      local_2c = 1;
      *(FT_Byte **)cur = limit;
      token_local->start = limit + 1;
      limit = limit + 1;
      ps_parser_skip_spaces((PS_Parser)token_local);
      limit = token_local->start;
      do {
        bVar4 = false;
        if (limit < limit_00) {
          bVar4 = *(int *)&token_local[1].start == 0;
        }
        if (!bVar4) goto LAB_0030572e;
        if (*limit == '[') {
          local_2c = local_2c + 1;
        }
        else if ((*limit == ']') && (local_2c = local_2c + -1, local_2c < 1)) goto code_r0x00305690;
        token_local->start = limit;
        ps_parser_skip_PS_token((PS_Parser)token_local);
        ps_parser_skip_spaces((PS_Parser)token_local);
        limit = token_local->start;
      } while( true );
    }
    if (FVar1 == '{') {
      cur[0x10] = '\x03';
      cur[0x11] = '\0';
      cur[0x12] = '\0';
      cur[0x13] = '\0';
      *(FT_Byte **)cur = limit;
      FVar2 = skip_procedure(&limit,limit_00);
      if (FVar2 == 0) {
        *(FT_Byte **)(cur + 8) = limit;
      }
    }
    else {
      *(FT_Byte **)cur = limit;
      uVar3 = 1;
      if (*limit == '/') {
        uVar3 = 4;
      }
      *(undefined4 *)(cur + 0x10) = uVar3;
      ps_parser_skip_PS_token((PS_Parser)token_local);
      limit = token_local->start;
      if (*(int *)&token_local[1].start == 0) {
        *(FT_Byte **)(cur + 8) = limit;
      }
    }
  }
LAB_0030572e:
  if (*(long *)(cur + 8) == 0) {
    cur[0] = '\0';
    cur[1] = '\0';
    cur[2] = '\0';
    cur[3] = '\0';
    cur[4] = '\0';
    cur[5] = '\0';
    cur[6] = '\0';
    cur[7] = '\0';
    cur[0x10] = '\0';
    cur[0x11] = '\0';
    cur[0x12] = '\0';
    cur[0x13] = '\0';
  }
  token_local->start = limit;
  return;
code_r0x00305690:
  limit = limit + 1;
  *(FT_Byte **)(cur + 8) = limit;
  goto LAB_0030572e;
}

Assistant:

FT_LOCAL_DEF( void )
  ps_parser_to_token( PS_Parser  parser,
                      T1_Token   token )
  {
    FT_Byte*  cur;
    FT_Byte*  limit;
    FT_Int    embed;


    token->type  = T1_TOKEN_TYPE_NONE;
    token->start = NULL;
    token->limit = NULL;

    /* first of all, skip leading whitespace */
    ps_parser_skip_spaces( parser );

    cur   = parser->cursor;
    limit = parser->limit;

    if ( cur >= limit )
      return;

    switch ( *cur )
    {
      /************* check for literal string *****************/
    case '(':
      token->type  = T1_TOKEN_TYPE_STRING;
      token->start = cur;

      if ( skip_literal_string( &cur, limit ) == FT_Err_Ok )
        token->limit = cur;
      break;

      /************* check for programs/array *****************/
    case '{':
      token->type  = T1_TOKEN_TYPE_ARRAY;
      token->start = cur;

      if ( skip_procedure( &cur, limit ) == FT_Err_Ok )
        token->limit = cur;
      break;

      /************* check for table/array ********************/
      /* XXX: in theory we should also look for "<<"          */
      /*      since this is semantically equivalent to "[";   */
      /*      in practice it doesn't matter (?)               */
    case '[':
      token->type  = T1_TOKEN_TYPE_ARRAY;
      embed        = 1;
      token->start = cur++;

      /* we need this to catch `[ ]' */
      parser->cursor = cur;
      ps_parser_skip_spaces( parser );
      cur = parser->cursor;

      while ( cur < limit && !parser->error )
      {
        /* XXX: this is wrong because it does not      */
        /*      skip comments, procedures, and strings */
        if ( *cur == '[' )
          embed++;
        else if ( *cur == ']' )
        {
          embed--;
          if ( embed <= 0 )
          {
            token->limit = ++cur;
            break;
          }
        }

        parser->cursor = cur;
        ps_parser_skip_PS_token( parser );
        /* we need this to catch `[XXX ]' */
        ps_parser_skip_spaces  ( parser );
        cur = parser->cursor;
      }
      break;

      /* ************ otherwise, it is any token **************/
    default:
      token->start = cur;
      token->type  = ( *cur == '/' ) ? T1_TOKEN_TYPE_KEY : T1_TOKEN_TYPE_ANY;
      ps_parser_skip_PS_token( parser );
      cur = parser->cursor;
      if ( !parser->error )
        token->limit = cur;
    }

    if ( !token->limit )
    {
      token->start = NULL;
      token->type  = T1_TOKEN_TYPE_NONE;
    }

    parser->cursor = cur;
  }